

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O3

char paranoid_yn(char *query,boolean paranoid)

{
  char cVar1;
  char buf [256];
  char query_yesno [512];
  int local_318 [64];
  char local_218 [520];
  
  if (paranoid != '\0') {
    sprintf(local_218,"%s [yes/no]");
    getlin(local_218,(char *)local_318);
    lcase((char *)local_318);
    cVar1 = 'n';
    if (local_318[0] == 0x736579) {
      cVar1 = 'y';
    }
    return cVar1;
  }
  cVar1 = yn_function(query,"yn",'n');
  return cVar1;
}

Assistant:

char paranoid_yn(const char *query, boolean paranoid)
{
	if (paranoid) {
	    char buf[BUFSZ];
	    char query_yesno[2 * BUFSZ];
	    /* put [yes/no] between question and question mark? */
	    sprintf(query_yesno, "%s [yes/no]", query);
	    getlin(query_yesno, buf);
	    lcase(buf);
	    return !(strcmp (buf, "yes")) ? 'y' : 'n';
	} else
	    return yn(query);
}